

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

bool Js::JavascriptStringHelpers<JITJavascriptString>::Equals
               (JITJavascriptString *aLeft,JITJavascriptString *aRight)

{
  bool bVar1;
  
  if (aLeft == aRight) {
    bVar1 = true;
  }
  else {
    if (aLeft->m_charLength == aRight->m_charLength) {
      bVar1 = JsUtil::CharacterBuffer<char16_t>::StaticEquals
                        (aLeft->m_pszValue,aRight->m_pszValue,aLeft->m_charLength);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool JavascriptStringHelpers<T>::Equals(T* aLeft, T* aRight)
    {
        if (aLeft == aRight) return true;

        // methods could get called a lot of times this can show up as regressions in benchmarks.
        volatile T** keepAliveLeftString = (volatile T**)& aLeft;
        volatile T** keepAliveRightString = (volatile T**)& aRight;
        auto keepAliveLambda = [&]() {
            UNREFERENCED_PARAMETER(keepAliveLeftString);
            UNREFERENCED_PARAMETER(keepAliveRightString);
        };

        if (aLeft->GetLength() != aRight->GetLength())
        {
            return false;
        }

        return JsUtil::CharacterBuffer<char16>::StaticEquals(aLeft->GetString(), aRight->GetString(), aLeft->GetLength());
    }